

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O0

bool okAssign<int>(vector<int,_std::allocator<int>_> *use_vector,HighsInt dimension,int value)

{
  bad_alloc *e;
  size_type in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type_conflict2 *)0x725a65);
  return true;
}

Assistant:

bool okAssign(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.assign(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okAssign fails with %s\n", e.what());
    return false;
  }
  return true;
}